

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nosimd.h
# Opt level: O0

void nosimd::arithmetic::div<long>(long *pSrc1,long *pSrc2,long *pDst,int len)

{
  int local_2c;
  int local_28;
  int i_1;
  int i;
  int len_local;
  long *pDst_local;
  long *pSrc2_local;
  long *pSrc1_local;
  
  if (pSrc1 == pDst) {
    for (local_28 = 0; local_28 < len; local_28 = local_28 + 1) {
      pDst[local_28] = pDst[local_28] / pSrc2[local_28];
    }
  }
  else {
    for (local_2c = 0; local_2c < len; local_2c = local_2c + 1) {
      pDst[local_2c] = pSrc1[local_2c] / pSrc2[local_2c];
    }
  }
  return;
}

Assistant:

inline void div(const _T * pSrc1, const _T * pSrc2, _T * pDst, int len)
        {
            if (pSrc1 == pDst)
            {
                for (int i = 0; i < len; ++i)
                    pDst[i] /= pSrc2[i];
            }
            else
            {
                for (int i = 0; i < len; ++i)
                    pDst[i] = pSrc1[i] / pSrc2[i];
            }
        }